

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lucky.c
# Opt level: O1

uint Kit_TruthSemiCanonicize_new_internal(word *pInOut,int nVars,char *pCanonPerm)

{
  uint CanonPhase;
  char tempArray [16];
  word pAux1 [1024];
  word pAux [1024];
  uint local_403c;
  char local_4038 [16];
  word local_4028 [1024];
  word local_2028 [1025];
  
  if (nVars < 0x11) {
    local_403c = Kit_TruthSemiCanonicize_Yasha(pInOut,nVars,pCanonPerm);
    luckyCanonicizer(pInOut,local_2028,local_4028,nVars,pCanonPerm,local_4038,&local_403c);
    return local_403c;
  }
  __assert_fail("nVars <= 16",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/bool/lucky/lucky.c"
                ,0x25c,"unsigned int Kit_TruthSemiCanonicize_new_internal(word *, int, char *)");
}

Assistant:

unsigned Kit_TruthSemiCanonicize_new_internal( word * pInOut, int nVars, char * pCanonPerm )
{
    word pAux[1024], pAux1[1024];
    char tempArray[16];
    unsigned CanonPhase;
    assert( nVars <= 16 );
    CanonPhase = Kit_TruthSemiCanonicize_Yasha( pInOut, nVars, pCanonPerm );
    luckyCanonicizer(pInOut, pAux, pAux1, nVars, pCanonPerm, tempArray, &CanonPhase);
    return CanonPhase;
}